

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O1

void __thiscall module::getMetaData(module *this,string *inpfile)

{
  ulong uVar1;
  pointer pcVar2;
  char cVar3;
  istream *piVar4;
  long lVar5;
  ostream *poVar6;
  mapped_type *pmVar7;
  runtime_error *this_00;
  ulong uVar8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  pointer __rhs;
  bool bVar9;
  char cVar10;
  string key_1;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  string key;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  kv;
  string value;
  stringstream ss;
  ifstream is;
  string local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_450;
  key_type local_438;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_418;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3f8;
  string local_3e0;
  stringstream local_3c0 [16];
  ostream local_3b0 [112];
  ios_base local_340 [264];
  long local_238 [4];
  byte abStack_218 [488];
  
  local_418.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_418.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_418.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::stringstream::stringstream(local_3c0);
  std::ifstream::ifstream((istream *)local_238,(string *)inpfile,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
    local_470._M_string_length = 0;
    local_470.field_2._M_local_buf[0] = '\0';
    cVar10 = '\0';
    while( true ) {
      cVar3 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_470,cVar3);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
      if (cVar10 == '\x01') {
        lVar5 = std::__cxx11::string::find((char *)&local_470,0x128b35,0);
        cVar10 = '\x02';
        if (lVar5 == -1) {
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (local_3b0,local_470._M_dataplus._M_p,local_470._M_string_length);
          cVar10 = '\x01';
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," \n",2);
        }
      }
      else {
        bVar9 = cVar10 == '\0';
        cVar10 = '\x02';
        if (bVar9) {
          lVar5 = std::__cxx11::string::find((char *)&local_470,0x128b17,0);
          cVar10 = lVar5 != -1;
        }
      }
    }
    this_01 = &this->metaData;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::clear(&this_01->_M_t);
    local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
    local_438._M_string_length = 0;
    local_438.field_2._M_local_buf[0] = '\0';
    std::__cxx11::stringbuf::str();
    utilities::split(&local_450,&local_490,'\n');
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_490._M_dataplus._M_p != &local_490.field_2) {
      operator_delete(local_490._M_dataplus._M_p);
    }
    if (local_450.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_450.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      __rhs = local_450.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      do {
        lVar5 = std::__cxx11::string::find((char)__rhs,0x3a);
        if (lVar5 == -1) {
          uVar1 = __rhs->_M_string_length;
          if (2 < uVar1) {
            pcVar2 = (__rhs->_M_dataplus)._M_p;
            uVar8 = 0;
            do {
              if (pcVar2[uVar8] == ',') {
                pcVar2[uVar8] = ' ';
              }
              uVar8 = uVar8 + 1;
            } while (uVar1 != uVar8);
            std::operator+(&local_490," ",__rhs);
            pmVar7 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](this_01,&local_438);
            std::__cxx11::string::_M_append((char *)pmVar7,(ulong)local_490._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_490._M_dataplus._M_p != &local_490.field_2) {
              operator_delete(local_490._M_dataplus._M_p);
            }
          }
        }
        else {
          utilities::split(&local_3f8,__rhs,':');
          utilities::trim(&local_490,
                          local_3f8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
          utilities::trim(&local_3e0,
                          local_3f8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 1);
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](this_01,&local_490);
          std::__cxx11::string::_M_assign((string *)pmVar7);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
            operator_delete(local_3e0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_490._M_dataplus._M_p != &local_490.field_2) {
            operator_delete(local_490._M_dataplus._M_p);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_3f8);
        }
        __rhs = __rhs + 1;
      } while (__rhs != local_450.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_450);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != &local_438.field_2) {
      operator_delete(local_438._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_470._M_dataplus._M_p != &local_470.field_2) {
      operator_delete(local_470._M_dataplus._M_p);
    }
    std::ifstream::~ifstream(local_238);
    std::__cxx11::stringstream::~stringstream(local_3c0);
    std::ios_base::~ios_base(local_340);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_418);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_470,"Error opening file: ",inpfile);
  std::runtime_error::runtime_error(this_00,(string *)&local_470);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void module::getMetaData(std::string inpfile)
{
    enum metadata_state
    {
        start = 0,
        begin,
        end
    };

    std::vector<std::string> tokens;
    metadata_state state = start;
    std::stringstream ss;
    
    std::ifstream is(inpfile);
    if (!is)
        throw std::runtime_error("Error opening file: " + inpfile);

    std::string line;
    while (std::getline(is, line)) {

        if(state == start)
        {
            if(line.find("BEGIN_JUCE_MODULE_DECLARATION") != std::string::npos)
            {
                state = begin;
                continue;
            }
        }
        else if(state == begin)
        {
            if(line.find("END_JUCE_MODULE_DECLARATION") != std::string::npos)
            {
                state = end;
            }
            else
            {
                ss << line << " \n";
            }
        }
    }

    metaData.clear();

    std::string key;
    auto lines = utilities::split(ss.str(),'\n');
    for(auto &l : lines)
    {
        if(l.find(':') != std::string::npos)
        {
            auto kv = utilities::split(l, ':');
            
            std::string key = utilities::trim(kv[0]);
            std::string value = utilities::trim(kv[1]);

            metaData[key] = value;
        }
        else
        {
            if(l.length() > 2)
            {
                std::replace( l.begin(), l.end(), ',', ' ');
                metaData[key] += " " + l;
            }
        }
    }
#if defined(DEBUG)
    std::cout << "[dependencies] = [" << metaData["dependencies"] << "]" << std::endl;
#endif
}